

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitSIMDTernary
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,SIMDTernary *curr)

{
  Expression **ppEVar1;
  Type local_30;
  Type local_28;
  Type local_20;
  SIMDTernary *local_18;
  SIMDTernary *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  local_18 = curr;
  curr_local = (SIMDTernary *)this;
  wasm::Type::Type(&local_20,v128);
  note(this,&curr->a,local_20);
  ppEVar1 = &local_18->b;
  wasm::Type::Type(&local_28,v128);
  note(this,ppEVar1,local_28);
  ppEVar1 = &local_18->c;
  wasm::Type::Type(&local_30,v128);
  note(this,ppEVar1,local_30);
  return;
}

Assistant:

void visitSIMDTernary(SIMDTernary* curr) {
    note(&curr->a, Type::v128);
    note(&curr->b, Type::v128);
    note(&curr->c, Type::v128);
  }